

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::ParseFunctionParam(State *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  ParseState copy;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar4 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar4) {
    state_local._7_1_ = false;
  }
  else {
    uVar1 = ((guard.state_)->parse_state).mangled_idx;
    uVar2 = ((guard.state_)->parse_state).out_cur_idx;
    uVar3 = *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx;
    bVar4 = ParseTwoCharToken(guard.state_,"fp");
    if (bVar4) {
      bVar4 = ParseCVQualifiers(guard.state_);
      bVar4 = Optional(bVar4);
      if (bVar4) {
        bVar4 = ParseNumber(guard.state_,(int *)0x0);
        bVar4 = Optional(bVar4);
        if ((bVar4) && (bVar4 = ParseOneCharToken(guard.state_,'_'), bVar4)) {
          state_local._7_1_ = true;
          goto LAB_00564481;
        }
      }
    }
    ((guard.state_)->parse_state).mangled_idx = uVar1;
    ((guard.state_)->parse_state).out_cur_idx = uVar2;
    *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
    bVar4 = ParseTwoCharToken(guard.state_,"fL");
    if (bVar4) {
      bVar4 = ParseNumber(guard.state_,(int *)0x0);
      bVar4 = Optional(bVar4);
      if ((bVar4) && (bVar4 = ParseOneCharToken(guard.state_,'p'), bVar4)) {
        bVar4 = ParseCVQualifiers(guard.state_);
        bVar4 = Optional(bVar4);
        if (bVar4) {
          bVar4 = ParseNumber(guard.state_,(int *)0x0);
          bVar4 = Optional(bVar4);
          if ((bVar4) && (bVar4 = ParseOneCharToken(guard.state_,'_'), bVar4)) {
            state_local._7_1_ = true;
            goto LAB_00564481;
          }
        }
      }
    }
    ((guard.state_)->parse_state).mangled_idx = uVar1;
    ((guard.state_)->parse_state).out_cur_idx = uVar2;
    *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
    state_local._7_1_ = ParseThreeCharToken(guard.state_,"fpT");
  }
LAB_00564481:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseFunctionParam(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  ParseState copy = state->parse_state;

  // Function-param expression (level 0).
  if (ParseTwoCharToken(state, "fp") && Optional(ParseCVQualifiers(state)) &&
      Optional(ParseNumber(state, nullptr)) && ParseOneCharToken(state, '_')) {
    return true;
  }
  state->parse_state = copy;

  // Function-param expression (level 1+).
  if (ParseTwoCharToken(state, "fL") && Optional(ParseNumber(state, nullptr)) &&
      ParseOneCharToken(state, 'p') && Optional(ParseCVQualifiers(state)) &&
      Optional(ParseNumber(state, nullptr)) && ParseOneCharToken(state, '_')) {
    return true;
  }
  state->parse_state = copy;

  return ParseThreeCharToken(state, "fpT");
}